

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

char * dmrC_show_instruction(dmr_C *C,instruction *insn)

{
  byte bVar1;
  uint uVar2;
  linearizer_state_t *plVar3;
  asm_rules *paVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  char *pcVar8;
  symbol *psVar9;
  char *pcVar10;
  basic_block_list *pbVar11;
  pseudo_t ppVar12;
  basic_block *pbVar13;
  long *plVar14;
  void *pvVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  char *__format;
  allocator *ident;
  char *pcVar19;
  undefined1 local_50 [8];
  ptr_list_iter argiter__;
  
  bVar6 = *(byte *)insn;
  plVar3 = C->L;
  pcVar19 = plVar3->buffer;
  if (insn->bb == (basic_block *)0x0) {
    plVar3->buffer[2] = '\0';
    pcVar19[0] = '#';
    pcVar19[1] = ' ';
    pcVar19 = plVar3->buffer + 2;
  }
  if (bVar6 < 0x41) {
    pcVar8 = stpcpy(pcVar19,opcodes_rel + *(int *)(opcodes_rel + (ulong)bVar6 * 4));
    pcVar19 = pcVar19 + ((int)pcVar8 - (int)pcVar19);
    psVar9 = insn->type;
    if (psVar9 == (symbol *)0x0) {
LAB_00129f9d:
      uVar17 = *(uint *)insn;
      if (0xff < uVar17) {
        pcVar8 = ".%d";
        goto LAB_00129fbb;
      }
    }
    else {
      if (*(char *)psVar9 == '\x03') {
        psVar9 = (psVar9->field_14).field_2.ctype.base_type;
      }
      if ((psVar9->field_14).field_2.ctype.base_type != &C->S->fp_type) goto LAB_00129f9d;
      uVar17 = *(uint *)insn;
      pcVar8 = ".f%d";
LAB_00129fbb:
      iVar7 = sprintf(pcVar19,pcVar8,(ulong)(uVar17 >> 8));
      pcVar19 = pcVar19 + iVar7;
    }
    psVar9 = insn->type;
    if (psVar9 != (symbol *)0x0) {
      bVar1 = *(byte *)psVar9;
      if (bVar1 == 3) {
        bVar1 = **(byte **)((long)&psVar9->field_14 + 0x38);
      }
      if (((bVar1 | 2) == 6) || (bVar1 == 5)) {
        pcVar19[0] = '*';
        pcVar19[1] = '\0';
        pcVar19 = pcVar19 + 1;
      }
    }
    builtin_strncpy(pcVar19,"                    ",0x14);
    pcVar19 = pcVar19 + 1;
  }
  plVar3 = C->L;
  if (pcVar19 < plVar3->buffer + 0xc) {
    pcVar19 = plVar3->buffer + 0xc;
  }
  iVar7 = (int)pcVar19;
  pcVar8 = pcVar19;
  switch(bVar6) {
  case 2:
    ppVar12 = (insn->field_6).field_4.phi_src;
    if (ppVar12 == &plVar3->void_pseudo || ppVar12 == (pseudo_t)0x0) goto switchD_0012a044_caseD_6;
    goto LAB_0012a5be;
  case 3:
    pbVar13 = (insn->field_6).field_1.bb_true;
LAB_0012a4ec:
    uVar18 = (ulong)pbVar13->nr;
    pcVar10 = ".L%u";
    pcVar8 = pcVar19;
LAB_0012a4f6:
    iVar7 = sprintf(pcVar8,pcVar10,uVar18);
    pcVar19 = pcVar8;
    break;
  case 4:
    pcVar8 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar7 = sprintf(pcVar19,"%s, .L%u, .L%u",pcVar8,(ulong)((insn->field_6).field_1.bb_true)->nr,
                    (ulong)((insn->field_6).field_1.bb_false)->nr);
    break;
  case 5:
    pcVar8 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar8 = stpcpy(pcVar19,pcVar8);
    pcVar8 = pcVar19 + ((int)pcVar8 - iVar7);
    ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)(insn->field_6).field_1.bb_true);
    while (plVar14 = (long *)ptrlist_iter_next((ptr_list_iter *)local_50), plVar14 != (long *)0x0) {
      lVar5 = plVar14[1];
      if (lVar5 == plVar14[2]) {
        iVar7 = sprintf(pcVar8,", %lld -> .L%u",lVar5,(ulong)*(uint *)(*plVar14 + 0x48));
      }
      else if (lVar5 < plVar14[2]) {
        iVar7 = sprintf(pcVar8,", %lld ... %lld -> .L%u");
      }
      else {
        iVar7 = sprintf(pcVar8,", default -> .L%u",(ulong)*(uint *)(*plVar14 + 0x48));
      }
      pcVar8 = pcVar8 + iVar7;
    }
  default:
    goto switchD_0012a044_caseD_6;
  case 7:
    pcVar8 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar8 = stpcpy(pcVar19,pcVar8);
    pcVar8 = pcVar19 + ((int)pcVar8 - iVar7);
    ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)(insn->field_6).field_1.bb_true);
    while (plVar14 = (long *)ptrlist_iter_next((ptr_list_iter *)local_50), plVar14 != (long *)0x0) {
      iVar7 = sprintf(pcVar8,", .L%u",(ulong)*(uint *)(*plVar14 + 0x48));
      pcVar8 = pcVar8 + iVar7;
    }
    goto switchD_0012a044_caseD_6;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
    pcVar10 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar16 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_6.src2);
    __format = "%s <- %s, %s";
    goto LAB_0012a077;
  case 0x23:
  case 0x24:
  case 0x3b:
  case 0x40:
    pcVar8 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar7 = sprintf(pcVar19,"%s <- %s",pcVar8,pcVar10);
    break;
  case 0x25:
    argiter__._16_8_ = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_6.src2);
    pcVar16 = dmrC_show_pseudo(C,(insn->field_6).field_6.src3);
    iVar7 = sprintf(pcVar19,"%s <- %s, %s, %s",argiter__._16_8_,pcVar8,pcVar10,pcVar16);
    break;
  case 0x29:
  case 0x3a:
    pcVar8 = dmrC_show_pseudo(C,(insn->field_5).target);
    uVar17 = (insn->field_6).field_5.offset;
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar16 = "%s <- %d[%s]";
    goto LAB_0012a18d;
  case 0x2a:
  case 0x39:
    pcVar8 = dmrC_show_pseudo(C,(insn->field_5).target);
    uVar17 = (insn->field_6).field_5.offset;
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar16 = "%s -> %d[%s]";
LAB_0012a18d:
    iVar7 = sprintf(pcVar19,pcVar16,pcVar8,(ulong)uVar17,pcVar10);
    pcVar8 = pcVar19 + iVar7;
    pbVar11 = (basic_block_list *)(insn->field_6).field_1.bb_false;
    if (pbVar11 == (basic_block_list *)0x0) goto switchD_0012a044_caseD_6;
    if (pbVar11->allocator_ == (allocator *)0x0) {
      pcVar19 = "; <anon symbol:%p>";
    }
    else {
      pbVar11 = (basic_block_list *)dmrC_show_ident(C,(ident *)pbVar11->allocator_);
      pcVar19 = "; %s";
    }
LAB_0012a78d:
    iVar7 = sprintf(pcVar8,pcVar19,pbVar11);
    pcVar19 = pcVar8;
    break;
  case 0x2b:
    pbVar13 = (insn->field_6).field_1.bb_false;
    pcVar8 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar7 = sprintf(pcVar19,"%s <- ",pcVar8);
    pcVar8 = pcVar19 + iVar7;
    if (pbVar13 == (basic_block *)0x0) {
      builtin_strncpy(pcVar19 + iVar7,"<none>",7);
      pcVar8 = pcVar8 + 6;
      goto switchD_0012a044_caseD_6;
    }
    bVar6 = (byte)*(undefined2 *)&pbVar13->pos;
    pcVar19 = pcVar8;
    if (bVar6 == 0x1c) {
      iVar7 = sprintf(pcVar8,"%Lf");
      break;
    }
    uVar18 = (ulong)bVar6;
    if (bVar6 != 2) {
      if (bVar6 == 3) {
        ident = pbVar13->parents->allocator_;
        goto LAB_0012a7ea;
      }
      if (bVar6 == 0x17) {
        pbVar13 = pbVar13->parents->list_[0x16];
        if (pbVar13 == (basic_block *)0x0) goto switchD_0012a044_caseD_6;
        goto LAB_0012a4ec;
      }
      if (bVar6 == 1) {
        pbVar11 = pbVar13->parents;
        pcVar19 = "%lld";
        goto LAB_0012a78d;
      }
      pcVar10 = "SETVAL EXPR TYPE %d";
      goto LAB_0012a4f6;
    }
    pbVar11 = (basic_block_list *)dmrC_show_string(C,(string *)pbVar13->children);
    pcVar19 = "%.40s";
    goto LAB_0012a78d;
  case 0x2c:
    pbVar11 = ((insn->field_6).field_1.bb_true)->parents;
    pcVar8 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar7 = sprintf(pcVar19,"%s <- ",pcVar8);
    pcVar8 = pcVar19 + iVar7;
    if (insn->bb == (basic_block *)0x0 && pbVar11 == (basic_block_list *)0x0)
    goto switchD_0012a044_caseD_6;
    pbVar13 = pbVar11->list_[0x16];
    pcVar19 = pcVar8;
    if (pbVar13 != (basic_block *)0x0) goto LAB_0012a4ec;
    ident = pbVar11->allocator_;
    if (ident == (allocator *)0x0) {
      pcVar19 = "<anon symbol:%p>";
      goto LAB_0012a78d;
    }
LAB_0012a7ea:
    pcVar19 = dmrC_show_ident(C,(ident *)ident);
    goto LAB_0012a5c6;
  case 0x2e:
    pcVar8 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar8 = stpcpy(pcVar19,pcVar8);
    pcVar8 = pcVar19 + ((int)pcVar8 - iVar7);
    ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)(insn->field_6).field_1.bb_true);
    pcVar19 = " <-";
    while (ppVar12 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_50),
          ppVar12 != (pseudo_t)0x0) {
      pcVar10 = dmrC_show_pseudo(C,ppVar12);
      iVar7 = sprintf(pcVar8,"%s %s",pcVar19,pcVar10);
      pcVar8 = pcVar8 + iVar7;
      pcVar19 = ",";
    }
    goto switchD_0012a044_caseD_6;
  case 0x2f:
    pcVar8 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar7 = sprintf(pcVar19,"%s <- %s    ",pcVar8,pcVar10);
    pcVar8 = pcVar19 + iVar7;
    ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)(insn->field_6).field_1.bb_false)
    ;
    while (pvVar15 = ptrlist_iter_next((ptr_list_iter *)local_50), pvVar15 != (void *)0x0) {
      pcVar19 = dmrC_show_pseudo(C,*(pseudo_t *)((long)pvVar15 + 0x20));
      iVar7 = sprintf(pcVar8," (%s)",pcVar19);
      pcVar8 = pcVar8 + iVar7;
    }
    goto switchD_0012a044_caseD_6;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
    pcVar8 = dmrC_show_pseudo(C,(insn->field_5).target);
    pbVar13 = (insn->field_6).field_1.bb_false;
    if (pbVar13 == (basic_block *)0x0) {
      uVar17 = 0;
    }
    else {
      uVar2 = *(uint *)&pbVar13->priv;
      uVar17 = 0;
      if (0 < (int)uVar2) {
        uVar17 = uVar2;
      }
    }
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar7 = sprintf(pcVar19,"%s <- (%d) %s",pcVar8,(ulong)uVar17,pcVar10);
    break;
  case 0x34:
  case 0x35:
    ppVar12 = (insn->field_5).target;
    if (ppVar12 != &plVar3->void_pseudo && ppVar12 != (pseudo_t)0x0) {
      pcVar8 = dmrC_show_pseudo(C,ppVar12);
      iVar7 = sprintf(pcVar19,"%s <- ",pcVar8);
      pcVar19 = pcVar19 + iVar7;
    }
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar8 = stpcpy(pcVar19,pcVar8);
    pcVar8 = pcVar19 + ((int)pcVar8 - (int)pcVar19);
    ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)(insn->field_6).field_1.bb_false)
    ;
    while (ppVar12 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_50),
          ppVar12 != (pseudo_t)0x0) {
      pcVar19 = dmrC_show_pseudo(C,ppVar12);
      iVar7 = sprintf(pcVar8,", %s",pcVar19);
      pcVar8 = pcVar8 + iVar7;
    }
    goto switchD_0012a044_caseD_6;
  case 0x38:
    pcVar8 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar7 = sprintf(pcVar19,"%s <- %s, %d, %d",pcVar8,pcVar10,(ulong)(insn->field_6).field_7.from,
                    (ulong)(insn->field_6).field_7.len);
    break;
  case 0x3c:
    ppVar12 = (insn->field_5).target;
LAB_0012a5be:
    pcVar19 = dmrC_show_pseudo(C,ppVar12);
LAB_0012a5c6:
    pcVar19 = stpcpy(pcVar8,pcVar19);
    iVar7 = (int)pcVar19 - (int)pcVar8;
    pcVar19 = pcVar8;
    break;
  case 0x3d:
    paVar4 = (insn->field_6).field_11.asm_rules;
    iVar7 = sprintf(pcVar19,"\"%s\"",(insn->field_6).field_1.bb_true);
    pcVar19 = show_asm_constraints(C,pcVar19 + iVar7,"\n\t\tout: ",paVar4->outputs);
    pcVar19 = show_asm_constraints(C,pcVar19,"\n\t\tin: ",paVar4->inputs);
    pcVar8 = show_asm_constraints(C,pcVar19,"\n\t\tclobber: ",paVar4->clobbers);
    goto switchD_0012a044_caseD_6;
  case 0x3e:
    pcVar8 = "check: ";
    if ((insn->field_6).field_10.check == 0) {
      pcVar8 = "";
    }
    iVar7 = sprintf(pcVar19,"%s%d",pcVar8,(ulong)(uint)(insn->field_6).field_10.increment);
    break;
  case 0x3f:
    pcVar10 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar16 = dmrC_show_pseudo(C,(insn->field_6).field_6.src2);
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_6.src3);
    __format = "%s between %s..%s";
LAB_0012a077:
    iVar7 = sprintf(pcVar19,__format,pcVar10,pcVar16,pcVar8);
  }
  pcVar8 = pcVar19 + iVar7;
switchD_0012a044_caseD_6:
  if (pcVar8 < &C->L->n) {
    pcVar8 = pcVar8 + 1;
    do {
      pcVar19 = pcVar8 + -2;
      pcVar8 = pcVar8 + -1;
    } while (*pcVar19 == ' ');
    *pcVar8 = '\0';
    return C->L->buffer;
  }
  dmrC_die(C,"instruction buffer overflowed %td\n",pcVar8 + (-0x470 - (long)C->L));
}

Assistant:

const char *dmrC_show_instruction(struct dmr_C *C, struct instruction *insn)
{
	int opcode = insn->opcode;
	char *buf;

	buf = C->L->buffer;
	if (!insn->bb)
		buf += sprintf(buf, "# ");

	if (opcode < (int)ARRAY_SIZE(opcodes)) {
		const char *op = opcodes[opcode];
		if (!op)
			buf += sprintf(buf, "opcode:%d", opcode);
		else
			buf += sprintf(buf, "%s", op);
		if (insn->type && dmrC_is_float_type(C->S, insn->type))
			buf += sprintf(buf, ".f%d", insn->size);
		else if (insn->size)
			buf += sprintf(buf, ".%d", insn->size);
		if (insn->type) {
			if (dmrC_is_ptr_type(insn->type))
				buf += sprintf(buf, "*");
		}

		memset(buf, ' ', 20);
		buf++;
	}

	if (buf < C->L->buffer + 12)
		buf = C->L->buffer + 12;
	switch (opcode) {
	case OP_RET:
		if (insn->src && insn->src != VOID_PSEUDO(C))
			buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->src));
		break;
	case OP_CBR:
		buf += sprintf(buf, "%s, .L%u, .L%u", dmrC_show_pseudo(C, insn->cond), insn->bb_true->nr, insn->bb_false->nr);
		break;

	case OP_BR:
		buf += sprintf(buf, ".L%u", insn->bb_true->nr);
		break;

	case OP_SYMADDR: {
		struct symbol *sym = insn->symbol->sym;
		buf += sprintf(buf, "%s <- ", dmrC_show_pseudo(C, insn->target));

		if (!insn->bb && !sym)
			break;
		if (sym->bb_target) {
			buf += sprintf(buf, ".L%u", sym->bb_target->nr);
			break;
		}
		if (sym->ident) {
			buf += sprintf(buf, "%s", dmrC_show_ident(C, sym->ident));
			break;
		}
		buf += sprintf(buf, "<anon symbol:%p>", sym);
		break;
	}
		
	case OP_SETVAL: {
		struct expression *expr = insn->val;
		struct symbol *sym;
		buf += sprintf(buf, "%s <- ", dmrC_show_pseudo(C, insn->target));

		if (!expr) {
			buf += sprintf(buf, "%s", "<none>");
			break;
		}
			
		switch (expr->type) {
		case EXPR_VALUE:
			buf += sprintf(buf, "%lld", expr->value);
			break;
		case EXPR_FVALUE:
			buf += sprintf(buf, "%Lf", expr->fvalue);
			break;
		case EXPR_STRING:
			buf += sprintf(buf, "%.40s", dmrC_show_string(C, expr->string));
			break;
		case EXPR_SYMBOL:
			buf += sprintf(buf, "%s", dmrC_show_ident(C, expr->symbol->ident));
			break;
		case EXPR_LABEL:
			sym = expr->symbol;
			if (sym->bb_target)
				buf += sprintf(buf, ".L%u", sym->bb_target->nr);
			break;
		default:
			buf += sprintf(buf, "SETVAL EXPR TYPE %d", expr->type);
		}
		break;
	}
	case OP_SWITCH: {
		struct multijmp *jmp;
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->cond));
		FOR_EACH_PTR(insn->multijmp_list, jmp) {
			if (jmp->begin == jmp->end)
				buf += sprintf(buf, ", %lld -> .L%u", jmp->begin, jmp->target->nr);
			else if (jmp->begin < jmp->end)
				buf += sprintf(buf, ", %lld ... %lld -> .L%u", jmp->begin, jmp->end, jmp->target->nr);
			else
				buf += sprintf(buf, ", default -> .L%u", jmp->target->nr);
		} END_FOR_EACH_PTR(jmp);
		break;
	}
	case OP_COMPUTEDGOTO: {
		struct multijmp *jmp;
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->target));
		FOR_EACH_PTR(insn->multijmp_list, jmp) {
			buf += sprintf(buf, ", .L%u", jmp->target->nr);
		} END_FOR_EACH_PTR(jmp);
		break;
	}

	case OP_PHISOURCE: {
		struct instruction *phi;
		buf += sprintf(buf, "%s <- %s    ", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->phi_src));
		FOR_EACH_PTR(insn->phi_users, phi) {
			buf += sprintf(buf, " (%s)", dmrC_show_pseudo(C, phi->target));
		} END_FOR_EACH_PTR(phi);
		break;
	}

	case OP_PHI: {
		pseudo_t phi;
		const char *s = " <-";
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->target));
		FOR_EACH_PTR(insn->phi_list, phi) {
			buf += sprintf(buf, "%s %s", s, dmrC_show_pseudo(C, phi));
			s = ",";
		} END_FOR_EACH_PTR(phi);
		break;
	}	
	case OP_LOAD: case OP_LNOP:
		buf += sprintf(buf, "%s <- %d[%s]", dmrC_show_pseudo(C, insn->target), insn->offset, dmrC_show_pseudo(C, insn->src));
		if (insn->orig_type) {
			struct symbol *sym = insn->orig_type;
			if (sym->ident) {
				buf += sprintf(buf, "; %s", dmrC_show_ident(C, sym->ident));
			}
			else {
				buf += sprintf(buf, "; <anon symbol:%p>", sym);
			}
		}
		break;
	case OP_STORE: case OP_SNOP:
		buf += sprintf(buf, "%s -> %d[%s]", dmrC_show_pseudo(C, insn->target), insn->offset, dmrC_show_pseudo(C, insn->src));
		if (insn->orig_type) {
			struct symbol *sym = insn->orig_type;
			if (sym->ident) {
				buf += sprintf(buf, "; %s", dmrC_show_ident(C, sym->ident));
			}
			else {
				buf += sprintf(buf, "; <anon symbol:%p>", sym);
			}
		}
		break;
	case OP_INLINED_CALL:
	case OP_CALL: {
		if (insn->target && insn->target != VOID_PSEUDO(C))
			buf += sprintf(buf, "%s <- ", dmrC_show_pseudo(C, insn->target));
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->func));
		{
			struct pseudo *arg;
			FOR_EACH_PTR(insn->arguments, arg) {
				buf += sprintf(buf, ", %s", dmrC_show_pseudo(C, arg));
			} END_FOR_EACH_PTR(arg);
		}
		break;
	}
	case OP_CAST:
	case OP_SCAST:
	case OP_FPCAST:
	case OP_PTRCAST:
		buf += sprintf(buf, "%s <- (%d) %s",
			dmrC_show_pseudo(C, insn->target),
			type_size(insn->orig_type),
			dmrC_show_pseudo(C, insn->src));
		break;
	case OP_ADD:
	case OP_SUB:
	case OP_MULU:
	case OP_MULS:
	case OP_DIVU:
	case OP_DIVS:
	case OP_MODU: 
	case OP_MODS:
	case OP_SHL:
	case OP_LSR: 
	case OP_ASR:
	case OP_AND:
	case OP_OR:      
	case OP_XOR:
	case OP_AND_BOOL:
	case OP_OR_BOOL:
	case OP_SET_EQ:
	case OP_SET_NE:
	case OP_SET_LE:
	case OP_SET_GE:
	case OP_SET_LT:
	case OP_SET_GT:
	case OP_SET_B:
	case OP_SET_A:
	case OP_SET_BE:
	case OP_SET_AE:

		buf += sprintf(buf, "%s <- %s, %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src1), dmrC_show_pseudo(C, insn->src2));
		break;

	case OP_SEL:
		buf += sprintf(buf, "%s <- %s, %s, %s", dmrC_show_pseudo(C, insn->target),
			dmrC_show_pseudo(C, insn->src1), dmrC_show_pseudo(C, insn->src2), dmrC_show_pseudo(C, insn->src3));
		break;

	case OP_SLICE:
		buf += sprintf(buf, "%s <- %s, %d, %d", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->base), insn->from, insn->len);
		break;

	case OP_NOT: case OP_NEG:
		buf += sprintf(buf, "%s <- %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src1));
		break;

	case OP_CONTEXT:
		buf += sprintf(buf, "%s%d", insn->check ? "check: " : "", insn->increment);
		break;
	case OP_RANGE:
		buf += sprintf(buf, "%s between %s..%s", dmrC_show_pseudo(C, insn->src1), dmrC_show_pseudo(C, insn->src2), dmrC_show_pseudo(C, insn->src3));
		break;
	case OP_NOP:
		buf += sprintf(buf, "%s <- %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src1));
		break;
	case OP_DEATHNOTE:
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->target));
		break;
	case OP_ASM:
		buf = show_asm(C, buf, insn);
		break;
	case OP_COPY:
		buf += sprintf(buf, "%s <- %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src));
		break;
	default:
		break;
	}

	if (buf >= C->L->buffer + sizeof(C->L->buffer))
		dmrC_die(C, "instruction buffer overflowed %td\n", buf - C->L->buffer);
	do { --buf; } while (*buf == ' ');
	*++buf = 0;
	return C->L->buffer;
}